

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O0

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetMessage(TgTypeParser *this,ptree *data)

{
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pbVar1;
  type_conflict tVar2;
  int iVar3;
  type_conflict4 tVar4;
  element_type *peVar5;
  type tVar6;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar7;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b50;
  type local_b20;
  code *local_b00;
  undefined8 local_af8;
  allocator local_ae9;
  string local_ae8 [32];
  shared_ptr<TgBot::SuccessfulPayment> local_ac8;
  code *local_ab8;
  undefined8 local_ab0;
  allocator local_aa1;
  string local_aa0 [32];
  shared_ptr<TgBot::Invoice> local_a80;
  code *local_a70;
  undefined8 local_a68;
  allocator local_a59;
  string local_a58 [32];
  shared_ptr<TgBot::Message> local_a38;
  long local_a28 [2];
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a18;
  long local_9e8 [2];
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9d8;
  bool local_9a2 [2];
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9a0;
  bool local_96a [2];
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_968;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_930;
  type local_900;
  bool local_8da [2];
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8d8;
  bool local_8a2 [2];
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8a0;
  code *local_870;
  undefined8 local_868;
  allocator local_859;
  string local_858 [32];
  vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
  local_838;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_818;
  type local_7e8;
  code *local_7c8;
  undefined8 local_7c0;
  allocator local_7b1;
  string local_7b0 [32];
  shared_ptr<TgBot::User> local_790;
  code *local_780;
  undefined8 local_778;
  allocator local_769;
  string local_768 [32];
  vector<std::shared_ptr<TgBot::User>,_std::allocator<std::shared_ptr<TgBot::User>_>_> local_748;
  code *local_730;
  undefined8 local_728;
  allocator local_719;
  string local_718 [32];
  shared_ptr<TgBot::User> local_6f8;
  code *local_6e8;
  undefined8 local_6e0;
  allocator local_6d1;
  string local_6d0 [32];
  shared_ptr<TgBot::Location> local_6b0;
  code *local_6a0;
  undefined8 local_698;
  allocator local_689;
  string local_688 [32];
  shared_ptr<TgBot::Contact> local_668;
  code *local_658;
  undefined8 local_650;
  allocator local_641;
  string local_640 [32];
  shared_ptr<TgBot::Video> local_620;
  code *local_610;
  undefined8 local_608;
  allocator local_5f9;
  string local_5f8 [32];
  shared_ptr<TgBot::Sticker> local_5d8;
  code *local_5c8;
  undefined8 local_5c0;
  allocator local_5b1;
  string local_5b0 [32];
  vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
  local_590;
  code *local_578;
  undefined8 local_570;
  allocator local_561;
  string local_560 [32];
  shared_ptr<TgBot::Game> local_540;
  code *local_530;
  undefined8 local_528;
  allocator local_519;
  string local_518 [32];
  shared_ptr<TgBot::Animation> local_4f8;
  code *local_4e8;
  undefined8 local_4e0;
  allocator local_4d1;
  string local_4d0 [32];
  shared_ptr<TgBot::Document> local_4b0;
  code *local_4a0;
  undefined8 local_498;
  allocator local_489;
  string local_488 [32];
  shared_ptr<TgBot::Audio> local_468;
  code *local_458;
  undefined8 local_450;
  allocator local_441;
  string local_440 [32];
  vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  local_420;
  code *local_408;
  undefined8 local_400;
  allocator local_3f1;
  string local_3f0 [32];
  vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  local_3d0;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b0;
  type local_380;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_358;
  type local_328;
  int local_308 [2];
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_300;
  code *local_2d0;
  undefined8 local_2c8;
  allocator local_2b9;
  string local_2b8 [32];
  shared_ptr<TgBot::Message> local_298;
  int local_288 [2];
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_280;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  type local_218;
  int local_1f8 [2];
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  code *local_1c0;
  undefined8 local_1b8;
  allocator local_1a9;
  string local_1a8 [32];
  shared_ptr<TgBot::Chat> local_188;
  code *local_178;
  undefined8 local_170;
  allocator local_161;
  string local_160 [32];
  shared_ptr<TgBot::User> local_140;
  allocator local_129;
  key_type local_128;
  iterator_adaptor<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::const_assoc_iterator,_boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>
  local_108;
  shared_ptr<TgBot::Chat> local_100;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  code *local_b8;
  undefined8 local_b0;
  allocator local_a1;
  string local_a0 [32];
  shared_ptr<TgBot::User> local_80 [2];
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  undefined1 local_21;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  ptree *data_local;
  TgTypeParser *this_local;
  shared_ptr<TgBot::Message> *result;
  
  local_21 = 0;
  local_20 = in_RDX;
  data_local = data;
  this_local = this;
  std::make_shared<TgBot::Message>();
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_58,"message_id",0x2e);
  iVar3 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<int>(pbVar1,&local_58);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar5->messageId = iVar3;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"from",&local_a1);
  local_b8 = parseJsonAndGetUser;
  local_b0 = 0;
  tryParseJson<TgBot::User>
            ((TgTypeParser *)local_80,(JsonToTgTypeFunc<TgBot::User>)data,
             (ptree *)parseJsonAndGetUser,(string *)0x0);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::User>::operator=(&peVar5->from,local_80);
  std::shared_ptr<TgBot::User>::~shared_ptr(local_80);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_e8,"date",0x2e);
  iVar3 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<int>(pbVar1,&local_e8);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar5->date = iVar3;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_e8);
  pbVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"chat",&local_129);
  local_108.m_iterator.node =
       (bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
        )boost::property_tree::
         basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(pbVar1,&local_128);
  boost::iterators::detail::
  iterator_facade_base<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::const_assoc_iterator,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::iterators::bidirectional_traversal_tag,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_long,_false,_false>
  ::operator->((iterator_facade_base<boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::const_assoc_iterator,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_boost::iterators::bidirectional_traversal_tag,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&,_long,_false,_false>
                *)&local_108);
  parseJsonAndGetChat((TgTypeParser *)&local_100,data);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::Chat>::operator=(&peVar5->chat,&local_100);
  std::shared_ptr<TgBot::Chat>::~shared_ptr(&local_100);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"forward_from",&local_161);
  local_178 = parseJsonAndGetUser;
  local_170 = 0;
  tryParseJson<TgBot::User>
            ((TgTypeParser *)&local_140,(JsonToTgTypeFunc<TgBot::User>)data,
             (ptree *)parseJsonAndGetUser,(string *)0x0);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::User>::operator=(&peVar5->forwardFrom,&local_140);
  std::shared_ptr<TgBot::User>::~shared_ptr(&local_140);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"forward_from_chat",&local_1a9);
  local_1c0 = parseJsonAndGetChat;
  local_1b8 = 0;
  tryParseJson<TgBot::Chat>
            ((TgTypeParser *)&local_188,(JsonToTgTypeFunc<TgBot::Chat>)data,
             (ptree *)parseJsonAndGetChat,(string *)0x0);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::Chat>::operator=(&peVar5->forwardFromChat,&local_188);
  std::shared_ptr<TgBot::Chat>::~shared_ptr(&local_188);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_1f0,"forward_from_message_id",0x2e);
  local_1f8[0] = 0;
  tVar4 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<int>(pbVar1,&local_1f0,local_1f8);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar5->forwardFromMessageId = tVar4;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_1f0);
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_248,"forward_signature",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_218,pbVar1,&local_248,"");
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::__cxx11::string::operator=((string *)&peVar5->forwardSignature,(string *)&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_248);
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_280,"forward_date",0x2e);
  local_288[0] = 0;
  tVar4 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<int>(pbVar1,&local_280,local_288);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar5->forwardDate = tVar4;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_280);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"reply_to_message",&local_2b9);
  local_2d0 = parseJsonAndGetMessage;
  local_2c8 = 0;
  tryParseJson<TgBot::Message>
            ((TgTypeParser *)&local_298,(JsonToTgTypeFunc<TgBot::Message>)data,
             (ptree *)parseJsonAndGetMessage,(string *)0x0);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::Message>::operator=(&peVar5->replyToMessage,&local_298);
  std::shared_ptr<TgBot::Message>::~shared_ptr(&local_298);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_300,"edit_date",0x2e);
  local_308[0] = 0;
  tVar4 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<int>(pbVar1,&local_300,local_308);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar5->editDate = tVar4;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_300);
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_358,"author_signature",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_328,pbVar1,&local_358,"");
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::__cxx11::string::operator=((string *)&peVar5->authorSignature,(string *)&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_358);
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_3b0,"text",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_380,pbVar1,&local_3b0,"");
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::__cxx11::string::operator=((string *)&peVar5->text,(string *)&local_380);
  std::__cxx11::string::~string((string *)&local_380);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_3b0);
  pbVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f0,"entities",&local_3f1);
  local_408 = parseJsonAndGetMessageEntity;
  local_400 = 0;
  parseJsonAndGetArray<TgBot::MessageEntity>
            (&local_3d0,(TgTypeParser *)data,0x33ffe0,(ptree *)0x0,&pbVar1->m_data);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::
  vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ::operator=(&peVar5->entities,&local_3d0);
  std::
  vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ::~vector(&local_3d0);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  pbVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_440,"caption_entities",&local_441);
  local_458 = parseJsonAndGetMessageEntity;
  local_450 = 0;
  parseJsonAndGetArray<TgBot::MessageEntity>
            (&local_420,(TgTypeParser *)data,0x33ffe0,(ptree *)0x0,&pbVar1->m_data);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::
  vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ::operator=(&peVar5->captionEntities,&local_420);
  std::
  vector<std::shared_ptr<TgBot::MessageEntity>,_std::allocator<std::shared_ptr<TgBot::MessageEntity>_>_>
  ::~vector(&local_420);
  std::__cxx11::string::~string(local_440);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_488,"audio",&local_489);
  local_4a0 = parseJsonAndGetAudio;
  local_498 = 0;
  tryParseJson<TgBot::Audio>
            ((TgTypeParser *)&local_468,(JsonToTgTypeFunc<TgBot::Audio>)data,
             (ptree *)parseJsonAndGetAudio,(string *)0x0);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::Audio>::operator=(&peVar5->audio,&local_468);
  std::shared_ptr<TgBot::Audio>::~shared_ptr(&local_468);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4d0,"document",&local_4d1);
  local_4e8 = parseJsonAndGetDocument;
  local_4e0 = 0;
  tryParseJson<TgBot::Document>
            ((TgTypeParser *)&local_4b0,(JsonToTgTypeFunc<TgBot::Document>)data,
             (ptree *)parseJsonAndGetDocument,(string *)0x0);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::Document>::operator=(&peVar5->document,&local_4b0);
  std::shared_ptr<TgBot::Document>::~shared_ptr(&local_4b0);
  std::__cxx11::string::~string(local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"animation",&local_519);
  local_530 = parseJsonAndGetAnimation;
  local_528 = 0;
  tryParseJson<TgBot::Animation>
            ((TgTypeParser *)&local_4f8,(JsonToTgTypeFunc<TgBot::Animation>)data,
             (ptree *)parseJsonAndGetAnimation,(string *)0x0);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::Animation>::operator=(&peVar5->animation,&local_4f8);
  std::shared_ptr<TgBot::Animation>::~shared_ptr(&local_4f8);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_560,"game",&local_561);
  local_578 = parseJsonAndGetGame;
  local_570 = 0;
  tryParseJson<TgBot::Game>
            ((TgTypeParser *)&local_540,(JsonToTgTypeFunc<TgBot::Game>)data,
             (ptree *)parseJsonAndGetGame,(string *)0x0);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::Game>::operator=(&peVar5->game,&local_540);
  std::shared_ptr<TgBot::Game>::~shared_ptr(&local_540);
  std::__cxx11::string::~string(local_560);
  std::allocator<char>::~allocator((allocator<char> *)&local_561);
  pbVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b0,"photo",&local_5b1);
  local_5c8 = parseJsonAndGetPhotoSize;
  local_5c0 = 0;
  parseJsonAndGetArray<TgBot::PhotoSize>
            (&local_590,(TgTypeParser *)data,0x341c70,(ptree *)0x0,&pbVar1->m_data);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::
  vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>::
  operator=(&peVar5->photo,&local_590);
  std::
  vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>::
  ~vector(&local_590);
  std::__cxx11::string::~string(local_5b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5f8,"sticker",&local_5f9);
  local_610 = parseJsonAndGetSticker;
  local_608 = 0;
  tryParseJson<TgBot::Sticker>
            ((TgTypeParser *)&local_5d8,(JsonToTgTypeFunc<TgBot::Sticker>)data,
             (ptree *)parseJsonAndGetSticker,(string *)0x0);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::Sticker>::operator=(&peVar5->sticker,&local_5d8);
  std::shared_ptr<TgBot::Sticker>::~shared_ptr(&local_5d8);
  std::__cxx11::string::~string(local_5f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_640,"video",&local_641);
  local_658 = parseJsonAndGetVideo;
  local_650 = 0;
  tryParseJson<TgBot::Video>
            ((TgTypeParser *)&local_620,(JsonToTgTypeFunc<TgBot::Video>)data,
             (ptree *)parseJsonAndGetVideo,(string *)0x0);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::Video>::operator=(&peVar5->video,&local_620);
  std::shared_ptr<TgBot::Video>::~shared_ptr(&local_620);
  std::__cxx11::string::~string(local_640);
  std::allocator<char>::~allocator((allocator<char> *)&local_641);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_688,"contact",&local_689);
  local_6a0 = parseJsonAndGetContact;
  local_698 = 0;
  tryParseJson<TgBot::Contact>
            ((TgTypeParser *)&local_668,(JsonToTgTypeFunc<TgBot::Contact>)data,
             (ptree *)parseJsonAndGetContact,(string *)0x0);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::Contact>::operator=(&peVar5->contact,&local_668);
  std::shared_ptr<TgBot::Contact>::~shared_ptr(&local_668);
  std::__cxx11::string::~string(local_688);
  std::allocator<char>::~allocator((allocator<char> *)&local_689);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d0,"location",&local_6d1);
  local_6e8 = parseJsonAndGetLocation;
  local_6e0 = 0;
  tryParseJson<TgBot::Location>
            ((TgTypeParser *)&local_6b0,(JsonToTgTypeFunc<TgBot::Location>)data,
             (ptree *)parseJsonAndGetLocation,(string *)0x0);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::Location>::operator=(&peVar5->location,&local_6b0);
  std::shared_ptr<TgBot::Location>::~shared_ptr(&local_6b0);
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_718,"new_chat_participant",&local_719);
  local_730 = parseJsonAndGetUser;
  local_728 = 0;
  tryParseJson<TgBot::User>
            ((TgTypeParser *)&local_6f8,(JsonToTgTypeFunc<TgBot::User>)data,
             (ptree *)parseJsonAndGetUser,(string *)0x0);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::User>::operator=(&peVar5->newChatMember,&local_6f8);
  std::shared_ptr<TgBot::User>::~shared_ptr(&local_6f8);
  std::__cxx11::string::~string(local_718);
  std::allocator<char>::~allocator((allocator<char> *)&local_719);
  pbVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_768,"new_chat_members",&local_769);
  local_780 = parseJsonAndGetUser;
  local_778 = 0;
  parseJsonAndGetArray<TgBot::User>
            (&local_748,(TgTypeParser *)data,0x33f6e0,(ptree *)0x0,&pbVar1->m_data);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::vector<std::shared_ptr<TgBot::User>,_std::allocator<std::shared_ptr<TgBot::User>_>_>::
  operator=(&peVar5->newChatMembers,&local_748);
  std::vector<std::shared_ptr<TgBot::User>,_std::allocator<std::shared_ptr<TgBot::User>_>_>::~vector
            (&local_748);
  std::__cxx11::string::~string(local_768);
  std::allocator<char>::~allocator((allocator<char> *)&local_769);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7b0,"left_chat_participant",&local_7b1);
  local_7c8 = parseJsonAndGetUser;
  local_7c0 = 0;
  tryParseJson<TgBot::User>
            ((TgTypeParser *)&local_790,(JsonToTgTypeFunc<TgBot::User>)data,
             (ptree *)parseJsonAndGetUser,(string *)0x0);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::User>::operator=(&peVar5->leftChatMember,&local_790);
  std::shared_ptr<TgBot::User>::~shared_ptr(&local_790);
  std::__cxx11::string::~string(local_7b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_818,"new_chat_title",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_7e8,pbVar1,&local_818,"");
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::__cxx11::string::operator=((string *)&peVar5->newChatTitle,(string *)&local_7e8);
  std::__cxx11::string::~string((string *)&local_7e8);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_818);
  pbVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_858,"new_chat_photo",&local_859);
  local_870 = parseJsonAndGetPhotoSize;
  local_868 = 0;
  parseJsonAndGetArray<TgBot::PhotoSize>
            (&local_838,(TgTypeParser *)data,0x341c70,(ptree *)0x0,&pbVar1->m_data);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::
  vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>::
  operator=(&peVar5->newChatPhoto,&local_838);
  std::
  vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>::
  ~vector(&local_838);
  std::__cxx11::string::~string(local_858);
  std::allocator<char>::~allocator((allocator<char> *)&local_859);
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_8a0,"delete_chat_photo",0x2e);
  local_8a2[0] = false;
  tVar2 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(pbVar1,&local_8a0,local_8a2);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar5->deleteChatPhoto = tVar2;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_8a0);
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_8d8,"group_chat_created",0x2e);
  local_8da[0] = false;
  tVar2 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(pbVar1,&local_8d8,local_8da);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar5->groupChatCreated = tVar2;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_8d8);
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_930,"caption",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_900,pbVar1,&local_930,"");
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::__cxx11::string::operator=((string *)&peVar5->caption,(string *)&local_900);
  std::__cxx11::string::~string((string *)&local_900);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_930);
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_968,"supergroup_chat_created",0x2e);
  local_96a[0] = false;
  tVar2 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(pbVar1,&local_968,local_96a);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar5->supergroupChatCreated = tVar2;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_968);
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_9a0,"channel_chat_created",0x2e);
  local_9a2[0] = false;
  tVar2 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(pbVar1,&local_9a0,local_9a2);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar5->channelChatCreated = tVar2;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_9a0);
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_9d8,"migrate_to_chat_id",0x2e);
  local_9e8[0] = 0;
  tVar6 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<long>(pbVar1,&local_9d8,local_9e8);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar5->migrateToChatId = tVar6;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_9d8);
  pbVar1 = local_20;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_a18,"migrate_from_chat_id",0x2e);
  local_a28[0] = 0;
  tVar6 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<long>(pbVar1,&local_a18,local_a28);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar5->migrateFromChatId = tVar6;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_a18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a58,"pinned_message",&local_a59);
  local_a70 = parseJsonAndGetMessage;
  local_a68 = 0;
  tryParseJson<TgBot::Message>
            ((TgTypeParser *)&local_a38,(JsonToTgTypeFunc<TgBot::Message>)data,
             (ptree *)parseJsonAndGetMessage,(string *)0x0);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::Message>::operator=(&peVar5->pinnedMessage,&local_a38);
  std::shared_ptr<TgBot::Message>::~shared_ptr(&local_a38);
  std::__cxx11::string::~string(local_a58);
  std::allocator<char>::~allocator((allocator<char> *)&local_a59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_aa0,"invoice",&local_aa1);
  local_ab8 = parseJsonAndGetInvoice;
  local_ab0 = 0;
  tryParseJson<TgBot::Invoice>
            ((TgTypeParser *)&local_a80,(JsonToTgTypeFunc<TgBot::Invoice>)data,
             (ptree *)parseJsonAndGetInvoice,(string *)0x0);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::Invoice>::operator=(&peVar5->invoice,&local_a80);
  std::shared_ptr<TgBot::Invoice>::~shared_ptr(&local_a80);
  std::__cxx11::string::~string(local_aa0);
  std::allocator<char>::~allocator((allocator<char> *)&local_aa1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ae8,"successful_payment",&local_ae9);
  local_b00 = parseJsonAndGetSuccessfulPayment;
  local_af8 = 0;
  tryParseJson<TgBot::SuccessfulPayment>
            ((TgTypeParser *)&local_ac8,(JsonToTgTypeFunc<TgBot::SuccessfulPayment>)data,
             (ptree *)parseJsonAndGetSuccessfulPayment,(string *)0x0);
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::shared_ptr<TgBot::SuccessfulPayment>::operator=(&peVar5->successfulPayment,&local_ac8);
  std::shared_ptr<TgBot::SuccessfulPayment>::~shared_ptr(&local_ac8);
  std::__cxx11::string::~string(local_ae8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ae9);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_b50,"connected_website",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_b20,local_20,&local_b50,"");
  peVar5 = std::__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TgBot::Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::__cxx11::string::operator=((string *)&peVar5->connectedWebsite,(string *)&local_b20);
  std::__cxx11::string::~string((string *)&local_b20);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_b50);
  PVar7.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar7.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (Ptr)PVar7.super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Message::Ptr TgTypeParser::parseJsonAndGetMessage(const ptree& data) const {
    auto result(make_shared<Message>());
    result->messageId = data.get<int32_t>("message_id");
    result->from = tryParseJson<User>(&TgTypeParser::parseJsonAndGetUser, data, "from");
    result->date = data.get<int32_t>("date");
    result->chat = parseJsonAndGetChat(data.find("chat")->second);
    result->forwardFrom = tryParseJson<User>(&TgTypeParser::parseJsonAndGetUser, data, "forward_from");
    result->forwardFromChat = tryParseJson<Chat>(&TgTypeParser::parseJsonAndGetChat, data, "forward_from_chat");
    result->forwardFromMessageId = data.get<int32_t>("forward_from_message_id", 0);
    result->forwardSignature = data.get("forward_signature", "");
    result->forwardDate = data.get("forward_date", 0);
    result->replyToMessage = tryParseJson<Message>(&TgTypeParser::parseJsonAndGetMessage, data, "reply_to_message");
    result->editDate = data.get<int32_t>("edit_date", 0);
    result->authorSignature = data.get("author_signature", "");
    result->text = data.get("text", "");
    result->entities = parseJsonAndGetArray<MessageEntity>(&TgTypeParser::parseJsonAndGetMessageEntity, data, "entities");
    result->captionEntities = parseJsonAndGetArray<MessageEntity>(&TgTypeParser::parseJsonAndGetMessageEntity, data, "caption_entities");
    result->audio = tryParseJson<Audio>(&TgTypeParser::parseJsonAndGetAudio, data, "audio");
    result->document = tryParseJson<Document>(&TgTypeParser::parseJsonAndGetDocument, data, "document");
    result->animation = tryParseJson<Animation>(&TgTypeParser::parseJsonAndGetAnimation, data, "animation");
    result->game = tryParseJson<Game>(&TgTypeParser::parseJsonAndGetGame, data, "game");
    result->photo = parseJsonAndGetArray<PhotoSize>(&TgTypeParser::parseJsonAndGetPhotoSize, data, "photo");
    result->sticker = tryParseJson<Sticker>(&TgTypeParser::parseJsonAndGetSticker, data, "sticker");
    result->video = tryParseJson<Video>(&TgTypeParser::parseJsonAndGetVideo, data, "video");
    result->contact = tryParseJson<Contact>(&TgTypeParser::parseJsonAndGetContact, data, "contact");
    result->location = tryParseJson<Location>(&TgTypeParser::parseJsonAndGetLocation, data, "location");
    result->newChatMember = tryParseJson<User>(&TgTypeParser::parseJsonAndGetUser, data, "new_chat_participant");
    result->newChatMembers = parseJsonAndGetArray<User>(&TgTypeParser::parseJsonAndGetUser, data, "new_chat_members");
    result->leftChatMember = tryParseJson<User>(&TgTypeParser::parseJsonAndGetUser, data, "left_chat_participant");
    result->newChatTitle = data.get("new_chat_title", "");
    result->newChatPhoto = parseJsonAndGetArray<PhotoSize>(&TgTypeParser::parseJsonAndGetPhotoSize, data, "new_chat_photo");
    result->deleteChatPhoto = data.get("delete_chat_photo", false);
    result->groupChatCreated = data.get("group_chat_created", false);
    result->caption = data.get("caption", "");
    result->supergroupChatCreated = data.get("supergroup_chat_created", false);
    result->channelChatCreated = data.get("channel_chat_created", false);
    result->migrateToChatId = data.get<int64_t>("migrate_to_chat_id", 0);
    result->migrateFromChatId = data.get<int64_t>("migrate_from_chat_id", 0);
    result->pinnedMessage = tryParseJson<Message>(&TgTypeParser::parseJsonAndGetMessage, data, "pinned_message");
    result->invoice = tryParseJson<Invoice>(&TgTypeParser::parseJsonAndGetInvoice, data, "invoice");
    result->successfulPayment = tryParseJson<SuccessfulPayment>(&TgTypeParser::parseJsonAndGetSuccessfulPayment, data, "successful_payment");
    result->connectedWebsite = data.get("connected_website", "");
    return result;
}